

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream-parse.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  atomic_count *paVar1;
  char *pcVar2;
  long *plVar3;
  func_type p_Var4;
  scheduler_operation *psVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  error_category *peVar7;
  _func_int ***ppp_Var8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  undefined2 port_num;
  bool bVar9;
  size_t sVar10;
  ostream *poVar11;
  scheduler_operation *psVar12;
  element_type *peVar13;
  element_type *peVar14;
  socklen_t __len;
  scheduler_operation *psVar15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var16;
  sockaddr *__addr;
  int iVar17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  execution_context eVar18;
  spawn_helper<boost::asio::executor_binder<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_basiliscos[P]cpp_bredis_examples_stream_parse_cpp:129:36)>
  *context;
  undefined8 uVar19;
  service *psVar20;
  long in_FS_OFFSET;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  io_context io_service;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dst_parts;
  type ex;
  socket_t socket;
  string address;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmd_items;
  Connection<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  c;
  endpoint end_point;
  address ip_address;
  allocator_t<std::allocator<void>_> local_25a;
  allocator<void> local_259;
  io_context local_258;
  type local_248;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_228;
  scheduler_operation *local_210;
  undefined1 local_208 [12];
  uint uStack_1fc;
  element_type *local_1f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1f0;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [12];
  uint uStack_1cc;
  _Alloc_hider local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  anon_union_16_2_ba345be5_for_m_Storage local_1a8;
  ulong local_198;
  ptr local_190;
  undefined1 local_178 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  object_type local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148 [2];
  scheduler_operation *local_128;
  uint local_11c;
  element_type *local_118;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  undefined1 local_d0 [8];
  error_category *local_c8;
  data_union local_7c;
  address local_60;
  basic_executor_type<std::allocator<void>,_0U> local_40;
  
  if (argc < 2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Usage : ",8);
    pcVar2 = *argv;
    if (pcVar2 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x197408);
    }
    else {
      sVar10 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,sVar10);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," ip:port channel1 channel2 ...\n",0x1f);
    return 1;
  }
  std::__cxx11::string::string((string *)&local_108,argv[1],(allocator *)local_178);
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178._0_8_ = ":";
  local_178._8_8_ = "";
  boost::algorithm::detail::is_any_ofF<char>::is_any_ofF<boost::iterator_range<char_const*>>
            ((is_any_ofF<char> *)&local_1a8,(iterator_range<const_char_*> *)local_178);
  boost::algorithm::
  split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string&,boost::algorithm::detail::is_any_ofF<char>>
            (&local_228,&local_108,(is_any_ofF<char> *)&local_1a8,token_compress_off);
  if ((0x10 < local_198) && (local_1a8.m_dynSet != (set_value_type *)0x0)) {
    operator_delete__(local_1a8.m_dynSet);
  }
  if ((long)local_228.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_228.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0x40) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Usage : ",8);
    pcVar2 = *argv;
    if (pcVar2 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x197408);
    }
    else {
      sVar10 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,sVar10);
    }
    iVar17 = 1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," ip:port channel1 channel2 ...\n",0x1f);
    goto LAB_00155e7c;
  }
  local_178._0_8_ = &local_168;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"subscribe","");
  __l._M_len = 1;
  __l._M_array = (iterator)local_178;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_e8,__l,(allocator_type *)local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._0_8_ != &local_168) {
    operator_delete((void *)local_178._0_8_);
  }
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<char**,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (argv + 2,argv + (uint)argc,&local_e8);
  boost::asio::io_context::io_context(&local_258);
  pcVar2 = ((local_228.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
  boost::system::error_code::error_code((error_code *)local_d0);
  boost::asio::ip::make_address(&local_60,pcVar2,(error_code *)local_d0);
  if (local_d0[4] == true) {
    std::runtime_error::runtime_error((runtime_error *)local_178,"");
    local_158.__align = (anon_struct_8_0_00000001_for___align)local_148;
    local_178._0_8_ = &PTR__system_error_00192960;
    local_168._8_8_ = local_c8;
    local_158._8_8_ = 0;
    local_148[0]._M_local_buf[0] = '\0';
    boost::throw_exception<boost::system::system_error>((system_error *)local_178);
  }
  local_d0._0_2_ = 0;
  local_178._0_8_ =
       local_228.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
  local_178._8_8_ =
       local_178._0_8_ +
       local_228.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length;
  bVar9 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
          shr_unsigned<unsigned_short>
                    ((lexical_ostream_limited_src<char,_std::char_traits<char>_> *)local_178,
                     (unsigned_short *)local_d0);
  port_num = local_d0._0_2_;
  if (!bVar9) {
    local_178._0_8_ = &PTR__bad_cast_001934b0;
    local_178._8_8_ = &std::__cxx11::string::typeinfo;
    local_168._M_allocated_capacity = (size_type)&unsigned_short::typeinfo;
    boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)local_178);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"connecting to ",0xe);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,local_108._M_dataplus._M_p,local_108._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
  boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
            ((basic_endpoint<boost::asio::ip::tcp> *)&local_7c.base,&local_60,port_num);
  local_d0._0_4_ = (uint)(local_7c.base.sa_family != 2) * 8 + 2;
  __len = 0;
  boost::asio::
  basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_socket<boost::asio::io_context>
            ((basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              *)local_178,&local_258,(protocol_type *)local_d0,(type *)0x0);
  boost::asio::
  basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::connect((basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
             *)local_178,(int)&local_7c,__addr,__len);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"connected\n",10);
  boost::asio::detail::
  io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::io_object_impl((io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                    *)local_d0,
                   (io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                    *)local_178);
  psVar12 = (scheduler_operation *)boost::coroutines::stack_traits::default_size();
  local_40.bits_ = 0;
  local_40.io_context_ = &local_258;
  boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>>::
  strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>>
            ((strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>> *)
             &local_128,&local_40,(type *)0x0);
  this = local_110;
  if (local_110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_110->_M_use_count = local_110->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_110->_M_use_count = local_110->_M_use_count + 1;
    }
  }
  local_210 = psVar12;
  boost::coroutines::stack_traits::default_size();
  peVar13 = (element_type *)operator_new(0x58);
  (peVar13->coro_).
  super___weak_ptr<boost::coroutines::push_coroutine<void>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (peVar13->coro_).
  super___weak_ptr<boost::coroutines::push_coroutine<void>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this->_M_use_count = this->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this->_M_use_count = this->_M_use_count + 1;
    }
  }
  (peVar13->handler_).
  super_executor_binder_base<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>,_false>
  .executor_.executor_.io_context_ = (io_context *)local_128;
  (peVar13->handler_).
  super_executor_binder_base<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>,_false>
  .executor_.executor_.bits_ = local_11c;
  (peVar13->handler_).
  super_executor_binder_base<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>,_false>
  .executor_.impl_.
  super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = local_118;
  (peVar13->handler_).
  super_executor_binder_base<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>,_false>
  .executor_.impl_.
  super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = this;
  (peVar13->handler_).
  super_executor_binder_base<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>,_false>
  .target_ = boost::asio::detail::default_spawn_handler;
  peVar13->call_handler_ = true;
  (peVar13->function_).cmd_items = &local_e8;
  (peVar13->function_).c =
       (Connection<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
        *)local_d0;
  (peVar13->function_).io_service = &local_258;
  psVar12 = (scheduler_operation *)operator_new(0x18);
  psVar12->func_ = (func_type)0x100000001;
  psVar12->next_ = (scheduler_operation *)&PTR___Sp_counted_base_00193b78;
  *(element_type **)&psVar12->task_result_ = peVar13;
  local_208._0_8_ = local_128;
  uStack_1fc = local_11c;
  local_1f8 = local_118;
  local_1f0._M_pi = this;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this->_M_use_count = this->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this->_M_use_count = this->_M_use_count + 1;
    }
  }
  context = (spawn_helper<boost::asio::executor_binder<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_basiliscos[P]cpp_bredis_examples_stream_parse_cpp:129:36)>
             *)&asio_prefer_fn::static_instance<asio_prefer_fn::impl>::instance;
  asio_prefer_fn::impl::operator()
            (&local_248,(impl *)&asio_prefer_fn::static_instance<asio_prefer_fn::impl>::instance,
             (strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_> *)
             local_208,(possibly_t<0> *)&boost::asio::execution::detail::blocking_t<0>::possibly,
             &local_25a);
  if ((local_248.executor_.bits_ & 1) == 0) {
    for (plVar3 = *(long **)(in_FS_OFFSET + -8); plVar3 != (long *)0x0; plVar3 = (long *)plVar3[2])
    {
      if ((element_type *)*plVar3 ==
          (element_type *)
          local_248.impl_.
          super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr) {
        if (plVar3[1] != 0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&psVar12->func_ = *(int *)&psVar12->func_ + 1;
            UNLOCK();
          }
          else {
            *(int *)&psVar12->func_ = *(int *)&psVar12->func_ + 1;
          }
          local_1d8._0_8_ = local_210;
          stack0xfffffffffffffe30 =
               (error_category *)((ulong)stack0xfffffffffffffe30 & 0xffffffff00000000);
          local_1e8._0_8_ = peVar13;
          local_1e8._8_8_ = psVar12;
          boost_asio_handler_invoke_helpers::
          invoke<boost::asio::detail::spawn_helper<boost::asio::executor_binder<void(*)(),boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>>>,main::__0>,boost::asio::detail::spawn_helper<boost::asio::executor_binder<void(*)(),boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>>>,main::__0>>
                    ((spawn_helper<boost::asio::executor_binder<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_basiliscos[P]cpp_bredis_examples_stream_parse_cpp:129:36)>
                      *)local_1e8,context);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._8_8_);
          }
          goto LAB_00155d56;
        }
        break;
      }
    }
  }
  local_190.a = &local_259;
  if (*(long *)(in_FS_OFFSET + -0x10) == 0) {
    uVar19 = 0;
  }
  else {
    uVar19 = *(undefined8 *)(*(long *)(in_FS_OFFSET + -0x10) + 8);
  }
  peVar14 = (element_type *)
            boost::asio::detail::thread_info_base::
            allocate<boost::asio::detail::thread_info_base::default_tag>(uVar19,0x40);
  ((scheduler_operation *)&peVar14->mutex_)->next_ = (scheduler_operation *)0x0;
  *(code **)&peVar14->locked_ =
       boost::asio::detail::
       executor_op<boost::asio::detail::spawn_helper<boost::asio::executor_binder<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/basiliscos[P]cpp-bredis/examples/stream-parse.cpp:129:36)>,_std::allocator<void>,_boost::asio::detail::scheduler_operation>
       ::do_complete;
  *(uint *)&(peVar14->waiting_queue_).front_ = 0;
  (peVar14->waiting_queue_).back_ = (scheduler_operation *)peVar13;
  (peVar14->ready_queue_).front_ = psVar12;
  if (__libc_single_threaded == '\0') {
    LOCK();
    *(int *)&psVar12->func_ = *(int *)&psVar12->func_ + 1;
    UNLOCK();
  }
  else {
    *(int *)&psVar12->func_ = *(int *)&psVar12->func_ + 1;
  }
  (peVar14->ready_queue_).back_ = local_210;
  *(flag_unwind_t *)&peVar14->next_ = stack_unwind;
  local_190.v = peVar14;
  local_190.p = (executor_op<boost::asio::detail::spawn_helper<boost::asio::executor_binder<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_basiliscos[P]cpp_bredis_examples_stream_parse_cpp:129:36)>,_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                 *)peVar14;
  pthread_mutex_lock((pthread_mutex_t *)
                     (((weak_ptr<boost::coroutines::push_coroutine<void>_> *)
                      &(local_248.impl_.
                        super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->mutex_)->
                     super___weak_ptr<boost::coroutines::push_coroutine<void>,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr);
  if (*(bool *)((long)&(((weak_ptr<boost::coroutines::push_coroutine<void>_> *)
                        &(local_248.impl_.
                          super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->mutex_)->
                       super___weak_ptr<boost::coroutines::push_coroutine<void>,_(__gnu_cxx::_Lock_policy)2>
                       )._M_refcount._M_pi + 1) == true) {
    pthread_mutex_unlock
              ((pthread_mutex_t *)
               (((weak_ptr<boost::coroutines::push_coroutine<void>_> *)
                &(local_248.impl_.
                  super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->mutex_)->
               super___weak_ptr<boost::coroutines::push_coroutine<void>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr);
    p_Var4 = *(func_type *)&peVar14->locked_;
    boost::system::error_code::error_code((error_code *)local_1e8);
    (*p_Var4)((void *)0x0,(scheduler_operation *)peVar14,(error_code *)local_1e8,0);
LAB_00155d41:
    local_190.v = (void *)0x0;
    local_190.p = (executor_op<boost::asio::detail::spawn_helper<boost::asio::executor_binder<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_basiliscos[P]cpp_bredis_examples_stream_parse_cpp:129:36)>,_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                   *)0x0;
  }
  else {
    if (*(bool *)&(((weak_ptr<boost::coroutines::push_coroutine<void>_> *)
                   &(local_248.impl_.
                     super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->mutex_)->
                  super___weak_ptr<boost::coroutines::push_coroutine<void>,_(__gnu_cxx::_Lock_policy)2>
                  )._M_refcount._M_pi == true) {
      ((scheduler_operation *)&peVar14->mutex_)->next_ = (scheduler_operation *)0x0;
      psVar5 = *(scheduler_operation **)
                &(((executor_binder<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>_>
                    *)&(local_248.impl_.
                        super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->waiting_queue_)->
                 super_executor_binder_base<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>,_false>
                 ).executor_.executor_.field_0x8;
      psVar15 = (scheduler_operation *)
                &(local_248.impl_.
                  super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->waiting_queue_;
      if (psVar5 != (scheduler_operation *)0x0) {
        psVar15 = psVar5;
      }
      psVar15->next_ = (scheduler_operation *)peVar14;
      *(element_type **)
       &(((executor_binder<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>_>
           *)&(local_248.impl_.
               super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->waiting_queue_)->
        super_executor_binder_base<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>,_false>
        ).executor_.executor_.field_0x8 = peVar14;
      pthread_mutex_unlock
                ((pthread_mutex_t *)
                 (((weak_ptr<boost::coroutines::push_coroutine<void>_> *)
                  &(local_248.impl_.
                    super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->mutex_)->
                 super___weak_ptr<boost::coroutines::push_coroutine<void>,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr);
      goto LAB_00155d41;
    }
    *(bool *)&(((weak_ptr<boost::coroutines::push_coroutine<void>_> *)
               &(local_248.impl_.
                 super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->mutex_)->
              super___weak_ptr<boost::coroutines::push_coroutine<void>,_(__gnu_cxx::_Lock_policy)2>)
              ._M_refcount._M_pi = true;
    pthread_mutex_unlock
              ((pthread_mutex_t *)
               (((weak_ptr<boost::coroutines::push_coroutine<void>_> *)
                &(local_248.impl_.
                  super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->mutex_)->
               super___weak_ptr<boost::coroutines::push_coroutine<void>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr);
    ((scheduler_operation *)&peVar14->mutex_)->next_ = (scheduler_operation *)0x0;
    p_Var6 = (((executor_binder<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>_>
                *)&(local_248.impl_.
                    super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->waiting_queue_)->
             super_executor_binder_base<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>,_false>
             ).executor_.impl_.
             super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              &(((executor_binder<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>_>
                  *)&(local_248.impl_.
                      super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->waiting_queue_)->
               super_executor_binder_base<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>,_false>
               ).executor_.impl_;
    if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      p_Var16 = p_Var6;
    }
    ((__shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
      *)&p_Var16->_vptr__Sp_counted_base)->_M_ptr = peVar14;
    (((executor_binder<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>_>
       *)&(local_248.impl_.
           super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr)->waiting_queue_)->
    super_executor_binder_base<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>,_false>
    ).executor_.impl_.
    super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar14;
    local_190.v = (void *)0x0;
    local_190.p = (executor_op<boost::asio::detail::spawn_helper<boost::asio::executor_binder<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_basiliscos[P]cpp_bredis_examples_stream_parse_cpp:129:36)>,_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                   *)0x0;
    local_1e8._0_8_ =
         local_248.impl_.
         super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr;
    local_1e8._8_8_ =
         local_248.impl_.
         super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    if (local_248.impl_.
        super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_248.impl_.
         super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_M_use_count =
             (local_248.impl_.
              super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_248.impl_.
         super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_M_use_count =
             (local_248.impl_.
              super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_1d8._0_8_ = local_248.executor_.io_context_;
    stack0xfffffffffffffe30 = (error_category *)CONCAT44(local_248.executor_.bits_,local_1d8._8_4_);
    if ((scheduler_operation *)local_248.executor_.io_context_ != (scheduler_operation *)0x0) {
      LOCK();
      paVar1 = &(local_248.executor_.io_context_)->impl_->outstanding_work_;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
      UNLOCK();
    }
    boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>::
    execute<boost::asio::detail::strand_executor_service::invoker<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>const,void>>
              ((basic_executor_type<std::allocator<void>,0u> *)&local_248,
               (invoker<const_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>,_void>
                *)local_1e8);
    boost::asio::io_context::basic_executor_type<std::allocator<void>,_4U>::~basic_executor_type
              ((basic_executor_type<std::allocator<void>,_4U> *)local_1d8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._8_8_);
    }
  }
  boost::asio::detail::
  executor_op<boost::asio::detail::spawn_helper<boost::asio::executor_binder<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/basiliscos[P]cpp-bredis/examples/stream-parse.cpp:129:36)>,_std::allocator<void>,_boost::asio::detail::scheduler_operation>
  ::ptr::reset(&local_190);
LAB_00155d56:
  if (local_248.impl_.
      super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_248.impl_.
               super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_1f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1f0._M_pi);
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)psVar12);
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  if (local_110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_110);
  }
  boost::system::error_code::error_code((error_code *)local_208);
  boost::asio::detail::scheduler::run(local_258.impl_,(error_code *)local_208);
  uVar19 = local_208._0_8_;
  if (local_208[4] == true) {
    peVar7 = (error_category *)CONCAT44(uStack_1fc,local_208._8_4_);
    std::runtime_error::runtime_error((runtime_error *)local_1e8,"");
    local_1c8._M_p = (pointer)&local_1b8;
    local_1e8._0_8_ = &PTR__system_error_00192960;
    local_1d8._0_8_ = uVar19;
    local_1c0 = 0;
    local_1b8._M_local_buf[0] = '\0';
    unique0x1000126a = peVar7;
    boost::throw_exception<boost::system::system_error>((system_error *)local_1e8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"exiting...",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  boost::asio::detail::
  io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~io_object_impl((io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                     *)local_d0);
  boost::asio::detail::
  io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~io_object_impl((io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                     *)local_178);
  psVar20 = (local_258.super_execution_context.service_registry_)->first_service_;
  eVar18.service_registry_ = local_258.super_execution_context.service_registry_;
  if (psVar20 == (service *)0x0) {
LAB_00155e5c:
    pthread_mutex_destroy((pthread_mutex_t *)&(eVar18.service_registry_)->mutex_);
  }
  else {
    do {
      (*psVar20->_vptr_service[2])(psVar20);
      eVar18.service_registry_ = local_258.super_execution_context.service_registry_;
      psVar20 = psVar20->next_;
    } while (psVar20 != (service *)0x0);
    psVar20 = (local_258.super_execution_context.service_registry_)->first_service_;
    if (psVar20 == (service *)0x0) goto LAB_00155e5c;
    do {
      ppp_Var8 = &psVar20->_vptr_service;
      psVar20 = psVar20->next_;
      (*(*ppp_Var8)[1])();
      (eVar18.service_registry_)->first_service_ = psVar20;
    } while (psVar20 != (service *)0x0);
    eVar18.service_registry_ = local_258.super_execution_context.service_registry_;
    if (local_258.super_execution_context.service_registry_ != (service_registry *)0x0)
    goto LAB_00155e5c;
    eVar18.service_registry_ = (service_registry *)0x0;
  }
  operator_delete(eVar18.service_registry_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e8);
  iVar17 = 0;
LAB_00155e7c:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  return iVar17;
}

Assistant:

int main(int argc, char **argv) {
    // common setup
    using socket_t = asio::ip::tcp::socket;
    using next_layer_t = socket_t;
    using Buffer = boost::asio::streambuf;
    using Iterator = typename r::to_iterator<Buffer>::iterator_t;

    if (argc < 2) {
        std::cout << "Usage : " << argv[0]
                  << " ip:port channel1 channel2 ...\n";
        return 1;
    }

    std::string address(argv[1]);
    std::vector<std::string> dst_parts;
    boost::split(dst_parts, address, boost::is_any_of(":"));
    if (dst_parts.size() != 2) {
        std::cout << "Usage : " << argv[0]
                  << " ip:port channel1 channel2 ...\n";
        return 1;
    }

    std::vector<std::string> cmd_items{"subscribe"};
    std::copy(&argv[2], &argv[argc], std::back_inserter(cmd_items));

    // connect to redis
    asio::io_context io_service;
    auto ip_address = asio::ip::make_address(dst_parts[0]);
    auto port = boost::lexical_cast<std::uint16_t>(dst_parts[1]);
    std::cout << "connecting to " << address << "\n";
    asio::ip::tcp::endpoint end_point(ip_address, port);
    socket_t socket(io_service, end_point.protocol());
    socket.connect(end_point);
    std::cout << "connected\n";

    // wrap socket into bredis connection
    r::Connection<next_layer_t> c(std::move(socket));

    // let's have it synchronous-like sexy syntax
    boost::asio::spawn(io_service, [&](boost::asio::yield_context
                                           yield) mutable {
        boost::system::error_code error_code;

        // this is rx_and tx_buff simultaneously. Usually,
        // you should NOT do that, i.e. in case of pipe-lining
        Buffer buff;

        // write subscription command
        r::single_command_t subscribe_cmd{cmd_items.cbegin(), cmd_items.cend()};
        auto consumed = c.async_write(buff, subscribe_cmd, yield[error_code]);

        if (error_code) {
            std::cout << "subscription error :: " << error_code.message()
                      << "\n";
            io_service.stop();
        }
        std::cout << "send subscription\n";
        buff.consume(consumed);

        // check subscription
        {
            r::marker_helpers::check_subscription<Iterator> check_subscription{
                std::move(subscribe_cmd)};

            for (auto it = cmd_items.cbegin() + 1; it != cmd_items.cend();
                 it++) {
                auto parse_result = c.async_read(buff, yield[error_code], 1);
                std::cout << "received something...\n";
                if (error_code) {
                    std::cout
                        << "reading result error :: " << error_code.message()
                        << "\n";
                    io_service.stop();
                    return;
                }

                bool confimed = boost::apply_visitor(check_subscription,
                                                     parse_result.result);
                if (!confimed) {
                    std::cout << "subscription was not confirmed\n";
                    io_service.stop();
                    return;
                }
                buff.consume(parse_result.consumed);
            }
            std::cout << "subscription(s) has been confirmed\n";
        }

        while (true) {
            // read the reply
            auto parse_result = c.async_read(buff, yield[error_code], 1);
            std::cout << "received something...\n";
            if (error_code) {
                std::cout << "reading result error :: " << error_code.message()
                          << "\n";
                break;
            }
            // extract the JSON from message payload

            json_extractor<Iterator> extract;
            auto payload = boost::apply_visitor(extract, parse_result.result);

            if (payload) {
                std::cout << "on channel '" << payload.get().channel
                          << "' got json :: " << payload.get().json.serialize()
                          << "\n";
            } else {
                std::cout << "wasn't able to parse payload as json\n";
            }

            buff.consume(parse_result.consumed);
        }
        io_service.stop();

    });

    io_service.run();
    std::cout << "exiting..."
              << "\n";
    return 0;
}